

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

void kf_factor(int n,int *facbuf)

{
  undefined1 auVar1 [16];
  int *piVar2;
  int *in_RSI;
  int in_EDI;
  undefined1 auVar3 [64];
  double floor_sqrt;
  int p;
  int local_14;
  int *local_10;
  int local_4;
  undefined1 extraout_var [56];
  
  local_14 = 4;
  auVar3._0_8_ = sqrt((double)in_EDI);
  auVar3._8_56_ = extraout_var;
  auVar1 = vroundsd_avx(auVar3._0_16_,auVar3._0_16_,9);
  local_4 = in_EDI;
  local_10 = in_RSI;
  do {
    while (local_4 % local_14 != 0) {
      if (local_14 == 2) {
        local_14 = 3;
      }
      else if (local_14 == 4) {
        local_14 = 2;
      }
      else {
        local_14 = local_14 + 2;
      }
      if (auVar1._0_8_ < (double)local_14) {
        local_14 = local_4;
      }
    }
    local_4 = local_4 / local_14;
    piVar2 = local_10 + 1;
    *local_10 = local_14;
    local_10 = local_10 + 2;
    *piVar2 = local_4;
  } while (1 < local_4);
  return;
}

Assistant:

static 
void kf_factor(int n,int * facbuf)
{
    int p=4;
    double floor_sqrt;
    floor_sqrt = floor( sqrt((double)n) );

    /*factor out powers of 4, powers of 2, then any remaining primes */
    do {
        while (n % p) {
            switch (p) {
                case 4: p = 2; break;
                case 2: p = 3; break;
                default: p += 2; break;
            }
            if (p > floor_sqrt)
                p = n;          /* no more factors, skip to end */
        }
        n /= p;
        *facbuf++ = p;
        *facbuf++ = n;
    } while (n > 1);
}